

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_dump.cc
# Opt level: O0

void print_doc(fdb_kvs_handle *db,char *kvs_name,uint64_t offset,dump_option *opt)

{
  fdb_status fVar1;
  int64_t iVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  char *pcVar3;
  long in_RDI;
  _fdb_key_cmp_info cmp_info;
  docio_object doc;
  fdb_doc fdoc;
  fdb_status wr;
  keylen_t keylen;
  void *key;
  int64_t _offset;
  uint8_t is_wal_entry;
  docio_object *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  fdb_doc *doc_00;
  size_t in_stack_ffffffffffffff30;
  snap_handle *shandle;
  ushort in_stack_ffffffffffffff38;
  ushort in_stack_ffffffffffffff3a;
  uint in_stack_ffffffffffffff3c;
  uint in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  uint in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  void *local_b0;
  long local_a8;
  void *local_a0;
  void *local_98;
  ushort local_3a;
  long local_18;
  
  docio_object::docio_object(in_stack_ffffffffffffff20);
  memset(&stack0xffffffffffffff38,0,0x38);
  iVar2 = docio_read_doc((docio_handle *)doc.key,doc._16_8_,(docio_object *)doc.length._8_8_,
                         doc.length.bodylen._3_1_);
  if (0 < iVar2) {
    local_18 = in_RDX;
    if ((in_stack_ffffffffffffff44 & 0x10) != 0) {
      local_18 = local_a8;
      iVar2 = docio_read_doc((docio_handle *)doc.key,doc._16_8_,(docio_object *)doc.length._8_8_,
                             doc.length.bodylen._3_1_);
      if (iVar2 < 1) {
        return;
      }
    }
    local_3a = in_stack_ffffffffffffff38;
    if (*(long *)(in_RDI + 0x18) != 0) {
      local_3a = in_stack_ffffffffffffff38 - 8;
    }
    printf("Doc ID: ");
    print_buf((fdb_kvs_handle *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
              (void *)CONCAT44(in_stack_ffffffffffffff3c,
                               CONCAT22(in_stack_ffffffffffffff3a,in_stack_ffffffffffffff38)),
              in_stack_ffffffffffffff30,SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0),
              (int)in_stack_ffffffffffffff28);
    if (in_RSI != 0) {
      printf("    KV store name: %s\n",in_RSI);
    }
    if (local_a8 != -1) {
      printf("    Sequence number: %lu\n",local_a8);
    }
    printf("    Byte offset: %lu\n",local_18);
    doc_00 = *(fdb_doc **)(in_RDI + 0x10);
    shandle = *(snap_handle **)(in_RDI + 0x18);
    fVar1 = wal_find((fdb_txn *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                     (filemgr *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (_fdb_key_cmp_info *)
                     CONCAT44(in_stack_ffffffffffffff3c,
                              CONCAT22(in_stack_ffffffffffffff3a,in_stack_ffffffffffffff38)),shandle
                     ,doc_00,*(uint64_t **)(in_RDI + 8));
    pcVar3 = "the main index";
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcVar3 = "WAL";
    }
    printf("    Indexed by %s\n",pcVar3);
    printf("    Length: %d (key), %d (metadata), %d (body)\n",(ulong)local_3a,
           (ulong)in_stack_ffffffffffffff3a,(ulong)in_stack_ffffffffffffff3c);
    if ((in_stack_ffffffffffffff44 & 2) != 0) {
      printf("    Compressed body size on disk: %d\n",(ulong)in_stack_ffffffffffffff40);
    }
    if ((in_stack_ffffffffffffff44 & 4) == 0) {
      if ((in_stack_ffffffffffffff44 & 1) == 0) {
        printf("    Status: normal\n");
      }
      else {
        printf("    Status: normal (written during compaction)\n");
      }
    }
    else {
      printf("    Status: deleted (timestamp: %u)\n",(ulong)in_stack_ffffffffffffff48);
    }
    if ((*(byte *)(in_RCX + 0x1d) & 1) == 0) {
      printf("    Metadata: ");
      print_buf((fdb_kvs_handle *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                (void *)CONCAT44(in_stack_ffffffffffffff3c,
                                 CONCAT22(in_stack_ffffffffffffff3a,in_stack_ffffffffffffff38)),
                (size_t)shandle,SUB81((ulong)doc_00 >> 0x38,0),(int)doc_00);
    }
    if ((*(byte *)(in_RCX + 0x1c) & 1) == 0) {
      printf("    Body: ");
      print_buf((fdb_kvs_handle *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                (void *)CONCAT44(in_stack_ffffffffffffff3c,
                                 CONCAT22(in_stack_ffffffffffffff3a,in_stack_ffffffffffffff38)),
                (size_t)shandle,SUB81((ulong)doc_00 >> 0x38,0),(int)doc_00);
    }
    printf("\n");
    free(local_b0);
    free(local_a0);
    free(local_98);
  }
  return;
}

Assistant:

void print_doc(fdb_kvs_handle *db,
               char *kvs_name,
               uint64_t offset,
               struct dump_option *opt)
{
    uint8_t is_wal_entry;
    int64_t _offset;
    void *key;
    keylen_t keylen;
    fdb_status wr;
    fdb_doc fdoc;
    struct docio_object doc;
    struct _fdb_key_cmp_info cmp_info;

    memset(&doc, 0, sizeof(struct docio_object));

    _offset = docio_read_doc(db->dhandle, offset, &doc, true);
    if (_offset <= 0) {
        return;
    }
    if (doc.length.flag & DOCIO_TXN_COMMITTED) {
        offset = doc.doc_offset;
        _offset = docio_read_doc(db->dhandle, offset, &doc, true);
        if (_offset <= 0) {
            return;
        }
    }

    if (db->kvs) {
        key = (uint8_t*)doc.key + sizeof(fdb_kvs_id_t);
        keylen = doc.length.keylen - sizeof(fdb_kvs_id_t);
    } else {
        key = doc.key;
        keylen = doc.length.keylen;
    }

    printf("Doc ID: ");
    print_buf(db, key, keylen,
              opt->print_key_in_hex, opt->hex_align);
    if (kvs_name) {
        printf("    KV store name: %s\n", kvs_name);
    }
    if (doc.seqnum != SEQNUM_NOT_USED) {
        printf("    Sequence number: %" _F64 "\n", doc.seqnum);
    }
    printf("    Byte offset: %" _F64 "\n", offset);

    cmp_info.kvs_config = db->kvs_config;
    cmp_info.kvs = db->kvs;
    fdoc.key = doc.key;
    fdoc.keylen = doc.length.keylen;
    wr = wal_find(&db->file->global_txn, db->file,
                  &cmp_info, db->shandle, &fdoc, &offset);
    is_wal_entry = (wr == FDB_RESULT_SUCCESS)?(1):(0);
    printf("    Indexed by %s\n", (is_wal_entry)?("WAL"):("the main index"));
    printf("    Length: %d (key), %d (metadata), %d (body)\n",
           keylen, doc.length.metalen, doc.length.bodylen);
    if (doc.length.flag & DOCIO_COMPRESSED) {
        printf("    Compressed body size on disk: %d\n",
               doc.length.bodylen_ondisk);
    }
    if (doc.length.flag & DOCIO_DELETED) {
        printf("    Status: deleted (timestamp: %u)\n", doc.timestamp);
    } else {
        if (doc.length.flag & DOCIO_COMPACT) {
            printf("    Status: normal (written during compaction)\n");
        } else {
            printf("    Status: normal\n");
        }
    }
    if (!opt->no_meta) {
        printf("    Metadata: ");
        print_buf(db, doc.meta, doc.length.metalen,
                  !opt->print_plain_meta, opt->hex_align);
    }
    if (!opt->no_body) {
        printf("    Body: ");
        print_buf(db, doc.body, doc.length.bodylen,
                  opt->print_body_in_hex, opt->hex_align);
    }
    printf("\n");

    free(doc.key);
    free(doc.meta);
    free(doc.body);
}